

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandNum_Generator.cc
# Opt level: O0

long __thiscall RandNum_Generator::generator(RandNum_Generator *this,int x,int i,int m)

{
  uint uVar1;
  ostream *poVar2;
  double dVar3;
  long r;
  int m_local;
  int i_local;
  int x_local;
  RandNum_Generator *this_local;
  
  if (x < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"y must be a non-negative integer!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local = (RandNum_Generator *)0xffffffffffffffff;
  }
  else if ((i < 0) || (0xff < i)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"i must be a non-negative integer less than 256!"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local = (RandNum_Generator *)0xffffffffffffffff;
  }
  else {
    if (m < 1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"m must be a positive integer!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    uVar1 = V[0][(x + i) % 0x100];
    dVar3 = floor((double)x / 256.0);
    this_local = (RandNum_Generator *)
                 ((long)(ulong)(uVar1 ^ V[1][((int)dVar3 + i) % 0x100]) % (long)m);
  }
  return (long)this_local;
}

Assistant:

long RandNum_Generator::generator(int x, int i, int m)
{

	long r = 0;
	//cout << "RandNum_Generator::generator" << endl;

	// y is a non-negative integer
	if (x < 0)
	{
		cerr << "y must be a non-negative integer!" << endl;
		return -1;
	}

	if ((i < 0) || (i >= 256 ))
	{
		cerr << "i must be a non-negative integer less than 256!" << endl;
		return -1;
	}

	if (m <= 0)
	{
		cerr << "m must be a positive integer!" << endl;
	}

	//cout << V[0][0] << endl;


	//mod 2^^8 = mod 256


	r = (V[0][(x + i) % 256] ^ V[1][((int)floor((double)x / 256.0) + i) % 256]);
	r =  r % m;

	return r;
}